

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::DiscardOStream::DiscardOStream(DiscardOStream *this)

{
  anon_class_1088_2_7e8621c7_for_discardBuf *in_RDI;
  
  std::ios::ios((ios *)&in_RDI[1].field_0x8);
  *(undefined8 *)in_RDI = 0x1ca830;
  *(undefined8 *)&in_RDI[1].field_0x8 = 0x1ca858;
  std::ostream::ostream(in_RDI,(streambuf *)&PTR_construction_vtable_24__001ca870);
  *(undefined8 *)in_RDI = 0x1ca830;
  *(undefined8 *)&in_RDI[1].field_0x8 = 0x1ca858;
  {unnamed_type#1}::DiscardOStream(in_RDI);
  return;
}

Assistant:

DiscardOStream()
            : std::ostream(&discardBuf) {}